

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_bitmap.c
# Opt level: O0

ALLEGRO_BITMAP_INTERFACE * ogl_bitmap_driver(void)

{
  if (glbmp_vt.draw_bitmap_region ==
      (_func_void_ALLEGRO_BITMAP_ptr_ALLEGRO_COLOR_float_float_float_float_int *)0x0) {
    glbmp_vt.draw_bitmap_region = ogl_draw_bitmap_region;
    glbmp_vt.upload_bitmap = ogl_upload_bitmap;
    glbmp_vt.update_clipping_rectangle = ogl_update_clipping_rectangle;
    glbmp_vt.destroy_bitmap = ogl_destroy_bitmap;
    glbmp_vt.bitmap_pointer_changed = ogl_bitmap_pointer_changed;
    glbmp_vt.lock_region = _al_ogl_lock_region_new;
    glbmp_vt.unlock_region = _al_ogl_unlock_region_new;
    glbmp_vt.lock_compressed_region = ogl_lock_compressed_region;
    glbmp_vt.unlock_compressed_region = ogl_unlock_compressed_region;
    glbmp_vt.backup_dirty_bitmap = ogl_backup_dirty_bitmap;
  }
  return &glbmp_vt;
}

Assistant:

static ALLEGRO_BITMAP_INTERFACE *ogl_bitmap_driver(void)
{
   if (glbmp_vt.draw_bitmap_region) {
      return &glbmp_vt;
   }

   glbmp_vt.draw_bitmap_region = ogl_draw_bitmap_region;
   glbmp_vt.upload_bitmap = ogl_upload_bitmap;
   glbmp_vt.update_clipping_rectangle = ogl_update_clipping_rectangle;
   glbmp_vt.destroy_bitmap = ogl_destroy_bitmap;
   glbmp_vt.bitmap_pointer_changed = ogl_bitmap_pointer_changed;
#if defined(ALLEGRO_CFG_OPENGLES)
   glbmp_vt.lock_region = _al_ogl_lock_region_gles;
   glbmp_vt.unlock_region = _al_ogl_unlock_region_gles;
#else
   glbmp_vt.lock_region = _al_ogl_lock_region_new;
   glbmp_vt.unlock_region = _al_ogl_unlock_region_new;
#endif
   glbmp_vt.lock_compressed_region = ogl_lock_compressed_region;
   glbmp_vt.unlock_compressed_region = ogl_unlock_compressed_region;
   glbmp_vt.backup_dirty_bitmap = ogl_backup_dirty_bitmap;

   return &glbmp_vt;
}